

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

parser_map *
argagg::validate_definitions
          (parser_map *__return_storage_ptr__,
          vector<argagg::definition,_std::allocator<argagg::definition>_> *definitions)

{
  char cVar1;
  pointer pbVar2;
  bool bVar3;
  pointer pdVar4;
  ostream *poVar5;
  invalid_flag *piVar6;
  definition *pdVar7;
  pointer flag;
  undefined1 local_218 [8];
  ostringstream msg;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>_>
  long_map;
  string local_60;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,argagg::definition_const*>,std::allocator<std::pair<std::__cxx11::string_const,argagg::definition_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_40;
  pointer local_38;
  
  msg._368_8_ = &long_map._M_h._M_rehash_policy._M_next_resize;
  long_map._M_h._M_buckets = (__buckets_ptr)0x1;
  long_map._M_h._M_bucket_count = 0;
  long_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  long_map._M_h._M_element_count._0_4_ = 0x3f800000;
  long_map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  long_map._M_h._M_rehash_policy._4_4_ = 0;
  long_map._M_h._M_rehash_policy._M_next_resize = 0;
  memset(__return_storage_ptr__,0,0x838);
  local_40 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,argagg::definition_const*>,std::allocator<std::pair<std::__cxx11::string_const,argagg::definition_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&__return_storage_ptr__->long_map;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)local_40,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&msg.field_0x170);
  pdVar4 = (definitions->super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>
           )._M_impl.super__Vector_impl_data._M_start;
  long_map._M_h._M_single_bucket =
       (__node_base_ptr)
       (definitions->super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pdVar4 == (pointer)long_map._M_h._M_single_bucket) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&msg.field_0x170);
      return __return_storage_ptr__;
    }
    flag = (pdVar4->flags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (pdVar4->flags).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_38 = pdVar4;
    if (pbVar2 == flag) break;
    for (; flag != pbVar2; flag = flag + 1) {
      bVar3 = is_valid_flag_definition((flag->_M_dataplus)._M_p);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
        poVar5 = std::operator<<((ostream *)local_218,"flag \"");
        poVar5 = std::operator<<(poVar5,(string *)flag);
        poVar5 = std::operator<<(poVar5,"\" specified for option \"");
        poVar5 = std::operator<<(poVar5,(string *)local_38);
        std::operator<<(poVar5,"\" is invalid");
        piVar6 = (invalid_flag *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        invalid_flag::runtime_error(piVar6,&local_60);
        __cxa_throw(piVar6,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar3 = flag_is_short((flag->_M_dataplus)._M_p);
      if (bVar3) {
        cVar1 = (flag->_M_dataplus)._M_p[1];
        pdVar7 = (__return_storage_ptr__->short_map)._M_elems[cVar1];
        if (pdVar7 != (definition *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          poVar5 = std::operator<<((ostream *)local_218,"duplicate short flag \"");
          poVar5 = std::operator<<(poVar5,(string *)flag);
          poVar5 = std::operator<<(poVar5,"\" found, specified by both option  \"");
          poVar5 = std::operator<<(poVar5,(string *)local_38);
          poVar5 = std::operator<<(poVar5,"\" and option \"");
          std::operator<<(poVar5,(string *)pdVar7);
          piVar6 = (invalid_flag *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          invalid_flag::runtime_error(piVar6,&local_60);
          __cxa_throw(piVar6,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
        }
        (__return_storage_ptr__->short_map)._M_elems[cVar1] = local_38;
      }
      else {
        bVar3 = parser_map::known_long_flag(__return_storage_ptr__,flag);
        if (bVar3) {
          pdVar7 = parser_map::get_definition_for_long_flag(__return_storage_ptr__,flag);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          poVar5 = std::operator<<((ostream *)local_218,"duplicate long flag \"");
          poVar5 = std::operator<<(poVar5,(string *)flag);
          poVar5 = std::operator<<(poVar5,"\" found, specified by both option  \"");
          poVar5 = std::operator<<(poVar5,(string *)local_38);
          poVar5 = std::operator<<(poVar5,"\" and option \"");
          std::operator<<(poVar5,(string *)pdVar7);
          piVar6 = (invalid_flag *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          invalid_flag::runtime_error(piVar6,&local_60);
          __cxa_throw(piVar6,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::string((string *)local_218,(string *)flag);
        msg.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = local_38;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,argagg::definition_const*>,std::allocator<std::pair<std::__cxx11::string_const,argagg::definition_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string,argagg::definition_const*>>
                  (local_40,(string *)local_218);
        std::__cxx11::string::~string((string *)local_218);
      }
    }
    pdVar4 = local_38 + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
  poVar5 = std::operator<<((ostream *)local_218,"option \"");
  poVar5 = std::operator<<(poVar5,(string *)local_38);
  std::operator<<(poVar5,"\" has no flag definitions");
  piVar6 = (invalid_flag *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  invalid_flag::runtime_error(piVar6,&local_60);
  __cxa_throw(piVar6,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
parser_map validate_definitions(
  const std::vector<definition>& definitions)
{
  std::unordered_map<std::string, const definition*> long_map;
  parser_map map {{{nullptr}}, std::move(long_map)};

  for (auto& defn : definitions) {

    if (defn.flags.size() == 0) {
      std::ostringstream msg;
      msg << "option \"" << defn.name << "\" has no flag definitions";
      throw invalid_flag(msg.str());
    }

    for (auto& flag : defn.flags) {

      if (!is_valid_flag_definition(flag.data())) {
        std::ostringstream msg;
        msg << "flag \"" << flag << "\" specified for option \"" << defn.name
            << "\" is invalid";
        throw invalid_flag(msg.str());
      }

      if (flag_is_short(flag.data())) {
        const int short_flag_letter = flag[1];
        const auto existing_short_flag = map.short_map[short_flag_letter];
        bool short_flag_already_exists = (existing_short_flag != nullptr);
        if (short_flag_already_exists) {
          std::ostringstream msg;
          msg << "duplicate short flag \"" << flag
              << "\" found, specified by both option  \"" << defn.name
              << "\" and option \"" << existing_short_flag->name;
          throw invalid_flag(msg.str());
        }
        map.short_map[short_flag_letter] = &defn;
        continue;
      }

      // If we're here then this is a valid, long-style flag.
      if (map.known_long_flag(flag)) {
        const auto existing_long_flag = map.get_definition_for_long_flag(flag);
        std::ostringstream msg;
        msg << "duplicate long flag \"" << flag
            << "\" found, specified by both option  \"" << defn.name
            << "\" and option \"" << existing_long_flag->name;
        throw invalid_flag(msg.str());
      }
      map.long_map.insert(std::make_pair(flag, &defn));
    }
  }

  return map;
}